

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

String * __thiscall
Rml::Element::GetAddress_abi_cxx11_
          (String *__return_storage_ptr__,Element *this,bool include_pseudo_classes,
          bool include_parents)

{
  bool bVar1;
  ulong uVar2;
  PseudoClassMap *this_00;
  String local_f8;
  reference local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
  *pseudo_class;
  const_iterator __end2;
  const_iterator __begin2;
  PseudoClassMap *__range2;
  PseudoClassMap *pseudo_classes;
  String local_90;
  undefined1 local_70 [8];
  String classes;
  undefined1 local_40 [8];
  String address;
  bool include_parents_local;
  bool include_pseudo_classes_local;
  Element *this_local;
  
  address.field_2._M_local_buf[0xe] = include_parents;
  address.field_2._M_local_buf[0xf] = include_pseudo_classes;
  ::std::__cxx11::string::string((string *)local_40,(string *)&this->tag);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::operator+=((string *)local_40,"#");
    ::std::__cxx11::string::operator+=((string *)local_40,(string *)&this->id);
  }
  ElementStyle::GetClassNames_abi_cxx11_((String *)local_70,&this->meta->style);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&pseudo_classes,(string *)local_70);
    StringUtilities::Replace(&local_90,(String *)&pseudo_classes,' ','.');
    ::std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&pseudo_classes);
    ::std::__cxx11::string::operator+=((string *)local_40,".");
    ::std::__cxx11::string::operator+=((string *)local_40,(string *)local_70);
  }
  if ((address.field_2._M_local_buf[0xf] & 1U) != 0) {
    this_00 = ElementStyle::GetActivePseudoClasses_abi_cxx11_(&this->meta->style);
    __end2 = itlib::
             flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
             ::begin(this_00);
    pseudo_class = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
                    *)itlib::
                      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
                      ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
                                       *)&pseudo_class), bVar1) {
      local_d8 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
                 ::operator*(&__end2);
      ::std::__cxx11::string::operator+=((string *)local_40,":");
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)local_d8);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>_>
      ::operator++(&__end2);
    }
  }
  if (((address.field_2._M_local_buf[0xe] & 1U) == 0) || (this->parent == (Element *)0x0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    ::std::__cxx11::string::operator+=((string *)local_40," < ");
    GetAddress_abi_cxx11_(&local_f8,this->parent,(bool)(address.field_2._M_local_buf[0xf] & 1),true)
    ;
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     &local_f8);
    ::std::__cxx11::string::~string((string *)&local_f8);
  }
  ::std::__cxx11::string::~string((string *)local_70);
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

String Element::GetAddress(bool include_pseudo_classes, bool include_parents) const
{
	// Add the tag name onto the address.
	String address(tag);

	// Add the ID if we have one.
	if (!id.empty())
	{
		address += "#";
		address += id;
	}

	String classes = meta->style.GetClassNames();
	if (!classes.empty())
	{
		classes = StringUtilities::Replace(classes, ' ', '.');
		address += ".";
		address += classes;
	}

	if (include_pseudo_classes)
	{
		const PseudoClassMap& pseudo_classes = meta->style.GetActivePseudoClasses();
		for (auto& pseudo_class : pseudo_classes)
		{
			address += ":";
			address += pseudo_class.first;
		}
	}

	if (include_parents && parent)
	{
		address += " < ";
		return address + parent->GetAddress(include_pseudo_classes, true);
	}
	else
		return address;
}